

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

void __thiscall
CoreML::Specification::RandomNormalStaticLayerParams::_internal_add_outputshape
          (RandomNormalStaticLayerParams *this,uint64_t value)

{
  uint64_t local_8;
  
  local_8 = value;
  google::protobuf::RepeatedField<unsigned_long>::Add(&this->outputshape_,&local_8);
  return;
}

Assistant:

inline void RandomNormalStaticLayerParams::_internal_add_outputshape(uint64_t value) {
  outputshape_.Add(value);
}